

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowest_lexicography.cpp
# Opt level: O2

string * si9ma::LowestLexicography::lowest_lexicography
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *strs)

{
  pointer pbVar1;
  pointer pbVar2;
  string str;
  string local_40 [32];
  
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>>
            ((strs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (strs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              )0x10b96c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_40);
  pbVar1 = (strs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (strs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string(local_40,(string *)pbVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string LowestLexicography::lowest_lexicography(vector<string> &strs) {

        std::sort(strs.begin(),strs.end(),cmp);

        string res = "";
        for (string str:strs){
            res += str;
        }

        return res;
    }